

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-mongo.c
# Opt level: O0

int reply_length(lua_State *L)

{
  uint32_t uVar1;
  uint32_t *puVar2;
  int length;
  int rawlen;
  char *rawlen_str;
  lua_State *L_local;
  
  puVar2 = (uint32_t *)luaL_checklstring(L,1,(size_t *)0x0);
  uVar1 = little_endian(*puVar2);
  lua_pushinteger(L,(long)(int)(uVar1 - 4));
  return 1;
}

Assistant:

static int
reply_length(lua_State *L) {
	const char * rawlen_str = luaL_checkstring(L, 1);
	int rawlen = 0;
	memcpy(&rawlen, rawlen_str, sizeof(int));
	int length = little_endian(rawlen);
	lua_pushinteger(L, length - 4);
	return 1;
}